

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# age.cpp
# Opt level: O3

void duckdb::AgeFunction(DataChunk *input,ExpressionState *state,Vector *result)

{
  ValidityMask *pVVar1;
  undefined1 *puVar2;
  VectorType VVar3;
  VectorType VVar4;
  unsigned_long *puVar5;
  interval_t *piVar6;
  timestamp_t timestamp_1;
  timestamp_t timestamp_2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  SelectionVector *pSVar8;
  data_ptr_t pdVar9;
  data_ptr_t pdVar10;
  _Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_> _Var11;
  undefined8 uVar12;
  __uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_> _Var13;
  sel_t *psVar14;
  byte bVar15;
  element_type *peVar16;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var17;
  reference vector;
  reference vector_00;
  TemplatedValidityData<unsigned_long> *pTVar18;
  SelectionVector *pSVar19;
  _Head_base<0UL,_unsigned_long_*,_false> _Var20;
  ulong uVar21;
  SelectionVector *pSVar22;
  ulong uVar23;
  timestamp_t lentry;
  SelectionVector *pSVar24;
  idx_t idx_in_entry;
  ulong uVar25;
  timestamp_t lentry_1;
  int64_t *piVar26;
  data_ptr_t pdVar27;
  data_ptr_t pdVar28;
  interval_t iVar29;
  UnifiedVectorFormat ldata;
  ulong local_120;
  UnifiedVectorFormat local_e8;
  element_type *local_98;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_90;
  data_ptr_t local_88;
  UnifiedVectorFormat local_80;
  idx_t local_38;
  
  vector = vector<duckdb::Vector,_true>::operator[](&input->data,0);
  vector_00 = vector<duckdb::Vector,_true>::operator[](&input->data,1);
  VVar3 = vector->vector_type;
  VVar4 = vector_00->vector_type;
  if ((VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR && (VVar4 ^ CONSTANT_VECTOR) == FLAT_VECTOR) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    puVar5 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    piVar6 = (interval_t *)result->data;
    if (((puVar5 == (unsigned_long *)0x0) || ((*puVar5 & 1) != 0)) &&
       ((puVar5 = (vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask,
        puVar5 == (unsigned_long *)0x0 || ((*puVar5 & 1) != 0)))) {
      timestamp_1.value = *(int64_t *)vector->data;
      if ((((timestamp_1.value == -0x7fffffffffffffff) || (timestamp_1.value == 0x7fffffffffffffff))
          || (timestamp_2.value = *(int64_t *)vector_00->data,
             timestamp_2.value == -0x7fffffffffffffff)) || (timestamp_2.value == 0x7fffffffffffffff)
         ) {
        _Var20._M_head_impl =
             (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (_Var20._M_head_impl == (unsigned_long *)0x0) {
          local_80.sel = (SelectionVector *)
                         (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)&local_e8,(unsigned_long *)&local_80);
          pdVar27 = local_e8.data;
          pSVar8 = local_e8.sel;
          local_e8.sel = (SelectionVector *)0x0;
          local_e8.data = (data_ptr_t)0x0;
          p_Var7 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)pSVar8;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdVar27;
          if ((p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
             (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7),
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8.data !=
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8.data);
          }
          pTVar18 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                                validity_data);
          _Var20._M_head_impl =
               (pTVar18->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
               _Var20._M_head_impl;
        }
        *(byte *)_Var20._M_head_impl = (byte)*_Var20._M_head_impl & 0xfe;
        iVar29 = (interval_t)ZEXT816(0);
      }
      else {
        iVar29 = Interval::GetAge(timestamp_1,timestamp_2);
      }
      *piVar6 = iVar29;
      return;
    }
  }
  else {
    pSVar8 = (SelectionVector *)input->count;
    if ((VVar4 ^ CONSTANT_VECTOR) == FLAT_VECTOR && VVar3 == FLAT_VECTOR) {
      pdVar27 = vector_00->data;
      puVar5 = (vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      pdVar9 = vector->data;
      if ((puVar5 == (unsigned_long *)0x0) || ((*puVar5 & 1) != 0)) {
        Vector::SetVectorType(result,FLAT_VECTOR);
        pdVar10 = result->data;
        FlatVector::VerifyFlatVector(result);
        pVVar1 = &result->validity;
        FlatVector::VerifyFlatVector(vector);
        (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity = (idx_t)pSVar8;
        if ((vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          p_Var7 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)0x0;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_80.sel = pSVar8;
          if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
          }
          (pVVar1->super_TemplatedValidityMask<unsigned_long>).validity_mask = (unsigned_long *)0x0;
        }
        else {
          local_80.sel = pSVar8;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long*const&,unsigned_long&>
                    ((duckdb *)&local_e8,(unsigned_long **)&vector->validity,
                     (unsigned_long *)&local_80);
          pdVar28 = local_e8.data;
          pSVar24 = local_e8.sel;
          local_e8.sel = (SelectionVector *)0x0;
          local_e8.data = (data_ptr_t)0x0;
          p_Var7 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)pSVar24;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdVar28;
          if ((p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
             (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7),
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8.data !=
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8.data);
          }
          pTVar18 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                                validity_data);
          _Var11.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
               (pTVar18->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>;
          (pVVar1->super_TemplatedValidityMask<unsigned_long>).validity_mask =
               (unsigned_long *)_Var11.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
          if (_Var11.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl !=
              (unsigned_long *)0x0) {
            puVar2 = (undefined1 *)
                     ((long)&pSVar8[2].selection_data.internal.
                             super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr + 7);
            if (puVar2 < (undefined1 *)0x40) {
              return;
            }
            uVar21 = 0;
            pSVar24 = (SelectionVector *)0x0;
            do {
              puVar5 = (pVVar1->super_TemplatedValidityMask<unsigned_long>).validity_mask;
              if (puVar5 == (unsigned_long *)0x0) {
                pSVar19 = (SelectionVector *)
                          &pSVar24[2].selection_data.internal.
                           super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount;
                if (pSVar8 <= pSVar19) {
                  pSVar19 = pSVar8;
                }
LAB_00ec3a58:
                pSVar22 = pSVar24;
                if (pSVar24 < pSVar19) {
                  uVar12 = *(undefined8 *)pdVar27;
                  piVar26 = (int64_t *)(pdVar10 + (long)pSVar24 * 0x10 + 8);
                  do {
                    iVar29 = BinaryLambdaWrapperWithNulls::
                             Operation<duckdb::AgeFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::timestamp_t,duckdb::timestamp_t,duckdb::interval_t>
                                       (*(undefined8 *)(pdVar9 + (long)pSVar24 * 8),uVar12,pVVar1,
                                        pSVar24);
                    piVar26[-1] = iVar29._0_8_;
                    *piVar26 = iVar29.micros;
                    pSVar24 = (SelectionVector *)((long)&pSVar24->sel_vector + 1);
                    piVar26 = piVar26 + 2;
                    pSVar22 = pSVar19;
                  } while (pSVar19 != pSVar24);
                }
              }
              else {
                uVar25 = puVar5[uVar21];
                pSVar19 = (SelectionVector *)
                          &pSVar24[2].selection_data.internal.
                           super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount;
                if (pSVar8 <= pSVar19) {
                  pSVar19 = pSVar8;
                }
                pSVar22 = pSVar19;
                if (uVar25 != 0) {
                  if (uVar25 == 0xffffffffffffffff) goto LAB_00ec3a58;
                  pSVar22 = pSVar24;
                  if (pSVar24 < pSVar19) {
                    piVar26 = (int64_t *)(pdVar10 + (long)pSVar24 * 0x10 + 8);
                    uVar23 = 0;
                    do {
                      if ((uVar25 >> (uVar23 & 0x3f) & 1) != 0) {
                        iVar29 = BinaryLambdaWrapperWithNulls::
                                 Operation<duckdb::AgeFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::timestamp_t,duckdb::timestamp_t,duckdb::interval_t>
                                           (*(undefined8 *)(pdVar9 + uVar23 * 8 + (long)pSVar24 * 8)
                                            ,*(undefined8 *)pdVar27,pVVar1,
                                            (long)&pSVar24->sel_vector + uVar23);
                        piVar26[-1] = iVar29._0_8_;
                        *piVar26 = iVar29.micros;
                      }
                      uVar23 = uVar23 + 1;
                      piVar26 = piVar26 + 2;
                      pSVar22 = pSVar19;
                    } while ((long)pSVar19 - (long)pSVar24 != uVar23);
                  }
                }
              }
              uVar21 = uVar21 + 1;
              pSVar24 = pSVar22;
              if (uVar21 == (ulong)puVar2 >> 6) {
                return;
              }
            } while( true );
          }
        }
        if (pSVar8 == (SelectionVector *)0x0) {
          return;
        }
        uVar12 = *(undefined8 *)pdVar27;
        piVar26 = (int64_t *)(pdVar10 + 8);
        pSVar24 = (SelectionVector *)0x0;
        do {
          iVar29 = BinaryLambdaWrapperWithNulls::
                   Operation<duckdb::AgeFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::timestamp_t,duckdb::timestamp_t,duckdb::interval_t>
                             (*(undefined8 *)(pdVar9 + (long)pSVar24 * 8),uVar12,pVVar1,pSVar24);
          piVar26[-1] = iVar29._0_8_;
          *piVar26 = iVar29.micros;
          pSVar24 = (SelectionVector *)((long)&pSVar24->sel_vector + 1);
          piVar26 = piVar26 + 2;
        } while (pSVar8 != pSVar24);
        return;
      }
    }
    else {
      if ((VVar3 ^ CONSTANT_VECTOR) != FLAT_VECTOR || VVar4 != FLAT_VECTOR) {
        if (VVar4 != FLAT_VECTOR || VVar3 != FLAT_VECTOR) {
          UnifiedVectorFormat::UnifiedVectorFormat(&local_e8);
          UnifiedVectorFormat::UnifiedVectorFormat(&local_80);
          Vector::ToUnifiedFormat(vector,(idx_t)pSVar8,&local_e8);
          Vector::ToUnifiedFormat(vector_00,(idx_t)pSVar8,&local_80);
          Vector::SetVectorType(result,FLAT_VECTOR);
          pdVar27 = result->data;
          FlatVector::VerifyFlatVector(result);
          pVVar1 = &result->validity;
          if (local_80.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0 &&
              local_e8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            if (pSVar8 != (SelectionVector *)0x0) {
              _Var13._M_t.
              super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
              super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
                   (((unsafe_unique_array<unsigned_long> *)&(local_e8.sel)->sel_vector)->
                   super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>)._M_t.
                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t;
              psVar14 = (local_80.sel)->sel_vector;
              piVar26 = (int64_t *)(pdVar27 + 8);
              pSVar24 = (SelectionVector *)0x0;
              do {
                pSVar19 = pSVar24;
                if ((_Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>)
                    _Var13._M_t.
                    super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                    super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl !=
                    (unsigned_long *)0x0) {
                  pSVar19 = (SelectionVector *)
                            (ulong)*(uint *)((long)_Var13._M_t.
                                                                                                      
                                                  super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                                                  .super__Head_base<0UL,_unsigned_long_*,_false>.
                                                  _M_head_impl + (long)pSVar24 * 4);
                }
                pSVar22 = pSVar24;
                if (psVar14 != (sel_t *)0x0) {
                  pSVar22 = (SelectionVector *)(ulong)psVar14[(long)pSVar24];
                }
                iVar29 = BinaryLambdaWrapperWithNulls::
                         Operation<duckdb::AgeFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::timestamp_t,duckdb::timestamp_t,duckdb::interval_t>
                                   (((_func_int ***)local_e8.data)[(long)pSVar19],
                                    *(undefined8 *)(local_80.data + (long)pSVar22 * 8),pVVar1,
                                    pSVar24);
                piVar26[-1] = iVar29._0_8_;
                *piVar26 = iVar29.micros;
                pSVar24 = (SelectionVector *)((long)&pSVar24->sel_vector + 1);
                piVar26 = piVar26 + 2;
              } while (pSVar8 != pSVar24);
            }
          }
          else if (pSVar8 != (SelectionVector *)0x0) {
            _Var13._M_t.
            super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
            super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
                 (((unsafe_unique_array<unsigned_long> *)&(local_e8.sel)->sel_vector)->
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>)._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t;
            psVar14 = (local_80.sel)->sel_vector;
            piVar26 = (int64_t *)(pdVar27 + 8);
            pSVar24 = (SelectionVector *)0x0;
            do {
              pSVar19 = pSVar24;
              if ((_Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>)
                  _Var13._M_t.
                  super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                  super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl != (unsigned_long *)0x0
                 ) {
                pSVar19 = (SelectionVector *)
                          (ulong)*(uint *)((long)_Var13._M_t.
                                                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                                                 .super__Head_base<0UL,_unsigned_long_*,_false>.
                                                 _M_head_impl + (long)pSVar24 * 4);
              }
              pSVar22 = pSVar24;
              if (psVar14 != (sel_t *)0x0) {
                pSVar22 = (SelectionVector *)(ulong)psVar14[(long)pSVar24];
              }
              if (((local_e8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                    (unsigned_long *)0x0) ||
                  ((local_e8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [(ulong)pSVar19 >> 6] >> ((ulong)pSVar19 & 0x3f) & 1) != 0)) &&
                 ((local_80.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                   (unsigned_long *)0x0 ||
                  ((local_80.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [(ulong)pSVar22 >> 6] >> ((ulong)pSVar22 & 0x3f) & 1) != 0)))) {
                iVar29 = BinaryLambdaWrapperWithNulls::
                         Operation<duckdb::AgeFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::timestamp_t,duckdb::timestamp_t,duckdb::interval_t>
                                   (((_func_int ***)local_e8.data)[(long)pSVar19],
                                    *(undefined8 *)(local_80.data + (long)pSVar22 * 8),pVVar1,
                                    pSVar24);
                piVar26[-1] = iVar29._0_8_;
                *piVar26 = iVar29.micros;
              }
              else {
                _Var20._M_head_impl =
                     (pVVar1->super_TemplatedValidityMask<unsigned_long>).validity_mask;
                if (_Var20._M_head_impl == (unsigned_long *)0x0) {
                  local_38 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
                  make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                            ((duckdb *)&local_98,&local_38);
                  p_Var17 = p_Stack_90;
                  peVar16 = local_98;
                  local_98 = (element_type *)0x0;
                  p_Stack_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  p_Var7 = (result->validity).super_TemplatedValidityMask<unsigned_long>.
                           validity_data.internal.
                           super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi;
                  (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                  internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr = peVar16;
                  (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                  internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi = p_Var17;
                  if ((p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                     (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7),
                     p_Stack_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_90);
                  }
                  pTVar18 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                            operator->(&(result->validity).
                                        super_TemplatedValidityMask<unsigned_long>.validity_data);
                  _Var20._M_head_impl =
                       (pTVar18->owned_data).
                       super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t
                       .super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                       .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                  (pVVar1->super_TemplatedValidityMask<unsigned_long>).validity_mask =
                       _Var20._M_head_impl;
                }
                bVar15 = (byte)pSVar24 & 0x3f;
                _Var20._M_head_impl[(ulong)pSVar24 >> 6] =
                     _Var20._M_head_impl[(ulong)pSVar24 >> 6] &
                     (-2L << bVar15 | 0xfffffffffffffffeU >> 0x40 - bVar15);
              }
              pSVar24 = (SelectionVector *)((long)&pSVar24->sel_vector + 1);
              piVar26 = piVar26 + 2;
            } while (pSVar8 != pSVar24);
          }
          if (local_80.owned_sel.selection_data.internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_80.owned_sel.selection_data.internal.
                       super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (local_80.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_80.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                       internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
          if (local_e8.owned_sel.selection_data.internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_e8.owned_sel.selection_data.internal.
                       super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (local_e8.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            return;
          }
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_e8.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                     internal.
                     super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
          return;
        }
        pdVar27 = vector->data;
        pdVar9 = vector_00->data;
        Vector::SetVectorType(result,FLAT_VECTOR);
        pdVar10 = result->data;
        FlatVector::VerifyFlatVector(result);
        pVVar1 = &result->validity;
        FlatVector::VerifyFlatVector(vector);
        (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity = (idx_t)pSVar8;
        if ((vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          p_Var7 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)0x0;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_80.sel = pSVar8;
          if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
          }
          (pVVar1->super_TemplatedValidityMask<unsigned_long>).validity_mask = (unsigned_long *)0x0;
        }
        else {
          local_80.sel = pSVar8;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long*const&,unsigned_long&>
                    ((duckdb *)&local_e8,(unsigned_long **)&vector->validity,
                     (unsigned_long *)&local_80);
          pdVar28 = local_e8.data;
          pSVar24 = local_e8.sel;
          local_e8.sel = (SelectionVector *)0x0;
          local_e8.data = (data_ptr_t)0x0;
          p_Var7 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)pSVar24;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdVar28;
          if ((p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
             (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7),
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8.data !=
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8.data);
          }
          pTVar18 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                                validity_data);
          _Var11.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
               (pTVar18->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>;
          (pVVar1->super_TemplatedValidityMask<unsigned_long>).validity_mask =
               (unsigned_long *)_Var11.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
          if (_Var11.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl !=
              (unsigned_long *)0x0) {
            FlatVector::VerifyFlatVector(vector_00);
            ValidityMask::Combine(pVVar1,&vector_00->validity,(idx_t)pSVar8);
            _Var20._M_head_impl = (pVVar1->super_TemplatedValidityMask<unsigned_long>).validity_mask
            ;
            goto LAB_00ec4274;
          }
        }
        FlatVector::VerifyFlatVector(vector_00);
        (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity = (idx_t)pSVar8;
        if ((vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          p_Var7 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)0x0;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_80.sel = pSVar8;
          if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
          }
          _Var20._M_head_impl = (unsigned_long *)0x0;
        }
        else {
          local_80.sel = pSVar8;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long*const&,unsigned_long&>
                    ((duckdb *)&local_e8,(unsigned_long **)&vector_00->validity,
                     (unsigned_long *)&local_80);
          pdVar28 = local_e8.data;
          pSVar24 = local_e8.sel;
          local_e8.sel = (SelectionVector *)0x0;
          local_e8.data = (data_ptr_t)0x0;
          p_Var7 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)pSVar24;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdVar28;
          if ((p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
             (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7),
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8.data !=
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8.data);
          }
          pTVar18 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                                validity_data);
          _Var20._M_head_impl =
               (pTVar18->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
        }
        (pVVar1->super_TemplatedValidityMask<unsigned_long>).validity_mask = _Var20._M_head_impl;
LAB_00ec4274:
        if (_Var20._M_head_impl == (unsigned_long *)0x0) {
          if (pSVar8 != (SelectionVector *)0x0) {
            piVar26 = (int64_t *)(pdVar10 + 8);
            pSVar24 = (SelectionVector *)0x0;
            do {
              iVar29 = BinaryLambdaWrapperWithNulls::
                       Operation<duckdb::AgeFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::timestamp_t,duckdb::timestamp_t,duckdb::interval_t>
                                 (*(undefined8 *)(pdVar27 + (long)pSVar24 * 8),
                                  *(undefined8 *)(pdVar9 + (long)pSVar24 * 8),pVVar1,pSVar24);
              piVar26[-1] = iVar29._0_8_;
              *piVar26 = iVar29.micros;
              pSVar24 = (SelectionVector *)((long)&pSVar24->sel_vector + 1);
              piVar26 = piVar26 + 2;
            } while (pSVar8 != pSVar24);
          }
        }
        else {
          puVar2 = (undefined1 *)
                   ((long)&pSVar8[2].selection_data.internal.
                           super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr + 7);
          if ((undefined1 *)0x3f < puVar2) {
            local_120 = 0;
            pSVar24 = (SelectionVector *)0x0;
            local_88 = pdVar27;
            do {
              puVar5 = (pVVar1->super_TemplatedValidityMask<unsigned_long>).validity_mask;
              pdVar28 = pdVar27;
              if (puVar5 == (unsigned_long *)0x0) {
                pSVar19 = (SelectionVector *)
                          &pSVar24[2].selection_data.internal.
                           super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount;
                if (pSVar8 <= pSVar19) {
                  pSVar19 = pSVar8;
                }
LAB_00ec42ee:
                pSVar22 = pSVar24;
                if (pSVar24 < pSVar19) {
                  piVar26 = (int64_t *)(pdVar10 + (long)pSVar24 * 0x10 + 8);
                  do {
                    iVar29 = BinaryLambdaWrapperWithNulls::
                             Operation<duckdb::AgeFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::timestamp_t,duckdb::timestamp_t,duckdb::interval_t>
                                       (*(undefined8 *)(pdVar27 + (long)pSVar24 * 8),
                                        *(undefined8 *)(pdVar9 + (long)pSVar24 * 8),pVVar1,pSVar24);
                    piVar26[-1] = iVar29._0_8_;
                    *piVar26 = iVar29.micros;
                    pSVar24 = (SelectionVector *)((long)&pSVar24->sel_vector + 1);
                    piVar26 = piVar26 + 2;
                    pSVar22 = pSVar19;
                  } while (pSVar19 != pSVar24);
                }
              }
              else {
                uVar21 = puVar5[local_120];
                pSVar19 = (SelectionVector *)
                          &pSVar24[2].selection_data.internal.
                           super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount;
                if (pSVar8 <= pSVar19) {
                  pSVar19 = pSVar8;
                }
                pSVar22 = pSVar19;
                if (uVar21 != 0) {
                  if (uVar21 == 0xffffffffffffffff) goto LAB_00ec42ee;
                  pSVar22 = pSVar24;
                  if (pSVar24 < pSVar19) {
                    piVar26 = (int64_t *)(pdVar10 + (long)pSVar24 * 0x10 + 8);
                    uVar25 = 0;
                    do {
                      if ((uVar21 >> (uVar25 & 0x3f) & 1) != 0) {
                        iVar29 = BinaryLambdaWrapperWithNulls::
                                 Operation<duckdb::AgeFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::timestamp_t,duckdb::timestamp_t,duckdb::interval_t>
                                           (*(undefined8 *)
                                             (pdVar27 + uVar25 * 8 + (long)pSVar24 * 8),
                                            *(undefined8 *)(pdVar9 + uVar25 * 8 + (long)pSVar24 * 8)
                                            ,pVVar1,(long)&pSVar24->sel_vector + uVar25);
                        piVar26[-1] = iVar29._0_8_;
                        *piVar26 = iVar29.micros;
                      }
                      uVar25 = uVar25 + 1;
                      piVar26 = piVar26 + 2;
                      pSVar22 = pSVar19;
                      pdVar28 = local_88;
                    } while ((long)pSVar19 - (long)pSVar24 != uVar25);
                  }
                }
              }
              local_120 = local_120 + 1;
              pSVar24 = pSVar22;
              pdVar27 = pdVar28;
            } while (local_120 != (ulong)puVar2 >> 6);
          }
        }
        return;
      }
      pdVar27 = vector->data;
      puVar5 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      pdVar9 = vector_00->data;
      if ((puVar5 == (unsigned_long *)0x0) || ((*puVar5 & 1) != 0)) {
        Vector::SetVectorType(result,FLAT_VECTOR);
        pdVar10 = result->data;
        FlatVector::VerifyFlatVector(result);
        pVVar1 = &result->validity;
        FlatVector::VerifyFlatVector(vector_00);
        (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity = (idx_t)pSVar8;
        if ((vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          p_Var7 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)0x0;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_80.sel = pSVar8;
          if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
          }
          (pVVar1->super_TemplatedValidityMask<unsigned_long>).validity_mask = (unsigned_long *)0x0;
        }
        else {
          local_80.sel = pSVar8;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long*const&,unsigned_long&>
                    ((duckdb *)&local_e8,(unsigned_long **)&vector_00->validity,
                     (unsigned_long *)&local_80);
          pdVar28 = local_e8.data;
          pSVar24 = local_e8.sel;
          local_e8.sel = (SelectionVector *)0x0;
          local_e8.data = (data_ptr_t)0x0;
          p_Var7 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)pSVar24;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdVar28;
          if ((p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
             (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7),
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8.data !=
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8.data);
          }
          pTVar18 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                                validity_data);
          _Var11.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
               (pTVar18->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>;
          (pVVar1->super_TemplatedValidityMask<unsigned_long>).validity_mask =
               (unsigned_long *)_Var11.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
          if (_Var11.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl !=
              (unsigned_long *)0x0) {
            puVar2 = (undefined1 *)
                     ((long)&pSVar8[2].selection_data.internal.
                             super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr + 7);
            if (puVar2 < (undefined1 *)0x40) {
              return;
            }
            uVar21 = 0;
            pSVar24 = (SelectionVector *)0x0;
            do {
              puVar5 = (pVVar1->super_TemplatedValidityMask<unsigned_long>).validity_mask;
              if (puVar5 == (unsigned_long *)0x0) {
                pSVar19 = (SelectionVector *)
                          &pSVar24[2].selection_data.internal.
                           super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount;
                if (pSVar8 <= pSVar19) {
                  pSVar19 = pSVar8;
                }
LAB_00ec3da3:
                pSVar22 = pSVar24;
                if (pSVar24 < pSVar19) {
                  uVar12 = *(undefined8 *)pdVar27;
                  piVar26 = (int64_t *)(pdVar10 + (long)pSVar24 * 0x10 + 8);
                  do {
                    iVar29 = BinaryLambdaWrapperWithNulls::
                             Operation<duckdb::AgeFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::timestamp_t,duckdb::timestamp_t,duckdb::interval_t>
                                       (uVar12,*(undefined8 *)(pdVar9 + (long)pSVar24 * 8),pVVar1,
                                        pSVar24);
                    piVar26[-1] = iVar29._0_8_;
                    *piVar26 = iVar29.micros;
                    pSVar24 = (SelectionVector *)((long)&pSVar24->sel_vector + 1);
                    piVar26 = piVar26 + 2;
                    pSVar22 = pSVar19;
                  } while (pSVar19 != pSVar24);
                }
              }
              else {
                uVar25 = puVar5[uVar21];
                pSVar19 = (SelectionVector *)
                          &pSVar24[2].selection_data.internal.
                           super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount;
                if (pSVar8 <= pSVar19) {
                  pSVar19 = pSVar8;
                }
                pSVar22 = pSVar19;
                if (uVar25 != 0) {
                  if (uVar25 == 0xffffffffffffffff) goto LAB_00ec3da3;
                  pSVar22 = pSVar24;
                  if (pSVar24 < pSVar19) {
                    piVar26 = (int64_t *)(pdVar10 + (long)pSVar24 * 0x10 + 8);
                    uVar23 = 0;
                    do {
                      if ((uVar25 >> (uVar23 & 0x3f) & 1) != 0) {
                        iVar29 = BinaryLambdaWrapperWithNulls::
                                 Operation<duckdb::AgeFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::timestamp_t,duckdb::timestamp_t,duckdb::interval_t>
                                           (*(undefined8 *)pdVar27,
                                            *(undefined8 *)(pdVar9 + uVar23 * 8 + (long)pSVar24 * 8)
                                            ,pVVar1,(long)&pSVar24->sel_vector + uVar23);
                        piVar26[-1] = iVar29._0_8_;
                        *piVar26 = iVar29.micros;
                      }
                      uVar23 = uVar23 + 1;
                      piVar26 = piVar26 + 2;
                      pSVar22 = pSVar19;
                    } while ((long)pSVar19 - (long)pSVar24 != uVar23);
                  }
                }
              }
              uVar21 = uVar21 + 1;
              pSVar24 = pSVar22;
              if (uVar21 == (ulong)puVar2 >> 6) {
                return;
              }
            } while( true );
          }
        }
        if (pSVar8 == (SelectionVector *)0x0) {
          return;
        }
        uVar12 = *(undefined8 *)pdVar27;
        piVar26 = (int64_t *)(pdVar10 + 8);
        pSVar24 = (SelectionVector *)0x0;
        do {
          iVar29 = BinaryLambdaWrapperWithNulls::
                   Operation<duckdb::AgeFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::timestamp_t,duckdb::timestamp_t,duckdb::interval_t>
                             (uVar12,*(undefined8 *)(pdVar9 + (long)pSVar24 * 8),pVVar1,pSVar24);
          piVar26[-1] = iVar29._0_8_;
          *piVar26 = iVar29.micros;
          pSVar24 = (SelectionVector *)((long)&pSVar24->sel_vector + 1);
          piVar26 = piVar26 + 2;
        } while (pSVar8 != pSVar24);
        return;
      }
    }
    Vector::SetVectorType(result,CONSTANT_VECTOR);
  }
  ConstantVector::SetNull(result,true);
  return;
}

Assistant:

static void AgeFunction(DataChunk &input, ExpressionState &state, Vector &result) {
	D_ASSERT(input.ColumnCount() == 2);

	BinaryExecutor::ExecuteWithNulls<timestamp_t, timestamp_t, interval_t>(
	    input.data[0], input.data[1], result, input.size(),
	    [&](timestamp_t input1, timestamp_t input2, ValidityMask &mask, idx_t idx) {
		    if (Timestamp::IsFinite(input1) && Timestamp::IsFinite(input2)) {
			    return Interval::GetAge(input1, input2);
		    } else {
			    mask.SetInvalid(idx);
			    return interval_t();
		    }
	    });
}